

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall ArgTest_PointerArg_Test::TestBody(ArgTest_PointerArg_Test *this)

{
  MockSpec<test_result_(const_void_*)> *pMVar1;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<const_void_*>_> visitor;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_f8;
  undefined4 local_e8;
  StrictMock<mock_visitor<const_void_*>_> local_d0;
  
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d0);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8.string,(void *)0x0);
  pMVar1 = mock_visitor<const_void_*>::gmock_visit
                     (&local_d0.super_mock_visitor<const_void_*>,
                      (Matcher<const_void_*> *)&local_f8.string);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x176,"visitor","visit(cp)");
  testing::internal::MatcherBase<const_void_*>::~MatcherBase
            ((MatcherBase<const_void_*> *)&local_f8.string);
  local_e8 = 0xc;
  local_f8.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_f8.string);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d0);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d0);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8.string,(void *)0x0);
  pMVar1 = mock_visitor<const_void_*>::gmock_visit
                     (&local_d0.super_mock_visitor<const_void_*>,
                      (Matcher<const_void_*> *)&local_f8.string);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x177,"visitor","visit(cp)");
  testing::internal::MatcherBase<const_void_*>::~MatcherBase
            ((MatcherBase<const_void_*> *)&local_f8.string);
  local_e8 = 0xc;
  local_f8.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_d0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&local_f8.string);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d0);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d0);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8.string,(void *)0x0);
  pMVar1 = mock_visitor<const_void_*>::gmock_visit
                     (&local_d0.super_mock_visitor<const_void_*>,
                      (Matcher<const_void_*> *)&local_f8.string);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x178,"visitor","visit(expected)");
  testing::internal::MatcherBase<const_void_*>::~MatcherBase
            ((MatcherBase<const_void_*> *)&local_f8.string);
  local_e8 = 0xc;
  local_f8.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_f8.string);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d0);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d0);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8.string,(void *)0x0);
  pMVar1 = mock_visitor<const_void_*>::gmock_visit
                     (&local_d0.super_mock_visitor<const_void_*>,
                      (Matcher<const_void_*> *)&local_f8.string);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x178,"visitor","visit(expected)");
  testing::internal::MatcherBase<const_void_*>::~MatcherBase
            ((MatcherBase<const_void_*> *)&local_f8.string);
  local_e8 = 0xc;
  local_f8.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_d0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&local_f8.string);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d0);
  return;
}

Assistant:

TEST(ArgTest, PointerArg) {
  void *p = FMT_NULL;
  const void *cp = FMT_NULL;
  CHECK_ARG_(char, cp, p);
  CHECK_ARG_(wchar_t, cp, p);
  CHECK_ARG(cp, );
}